

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

lws_tls_extant lws_tls_use_any_upgrade_check_extant(char *name)

{
  int iVar1;
  lws_tls_extant lVar2;
  uint uVar3;
  char buf [256];
  char acStack_128 [264];
  
  lws_snprintf(acStack_128,0xff,"%s.upd",name);
  iVar1 = lws_tls_extant(acStack_128);
  if (iVar1 == 0) {
    iVar1 = lws_tls_extant(name);
    if (iVar1 == 0) {
      uVar3 = 0;
      do {
        lws_snprintf(acStack_128,0xff,"%s.old.%d",name,(ulong)uVar3);
        iVar1 = rename(name,acStack_128);
        if (iVar1 == 0) {
          lws_snprintf(acStack_128,0xff,"%s.upd",name);
          goto LAB_0013c5c9;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != 0x32);
      _lws_log(4,"unable to rename %s\n",name);
    }
    else {
LAB_0013c5c9:
      iVar1 = rename(acStack_128,name);
      if (iVar1 == 0) goto LAB_0013c542;
      _lws_log(4,"unable to rename %s to %s\n",acStack_128,name);
    }
    lVar2 = LWS_TLS_EXTANT_ALTERNATIVE;
  }
  else {
LAB_0013c542:
    lVar2 = lws_tls_extant(name);
    lVar2 = lVar2 ^ LWS_TLS_EXTANT_YES;
  }
  return lVar2;
}

Assistant:

enum lws_tls_extant
lws_tls_use_any_upgrade_check_extant(const char *name)
{
#if !defined(LWS_PLAT_OPTEE) && !defined(LWS_AMAZON_RTOS)

	int n;

#if !defined(LWS_PLAT_FREERTOS)
	char buf[256];

	lws_snprintf(buf, sizeof(buf) - 1, "%s.upd", name);
	if (!lws_tls_extant(buf)) {
		/* ah there is an updated file... how about the desired file? */
		if (!lws_tls_extant(name)) {
			/* rename the desired file */
			for (n = 0; n < 50; n++) {
				lws_snprintf(buf, sizeof(buf) - 1,
					     "%s.old.%d", name, n);
				if (!rename(name, buf))
					break;
			}
			if (n == 50) {
				lwsl_notice("unable to rename %s\n", name);

				return LWS_TLS_EXTANT_ALTERNATIVE;
			}
			lws_snprintf(buf, sizeof(buf) - 1, "%s.upd", name);
		}
		/* desired file is out of the way, rename the updated file */
		if (rename(buf, name)) {
			lwsl_notice("unable to rename %s to %s\n", buf, name);

			return LWS_TLS_EXTANT_ALTERNATIVE;
		}
	}

	if (lws_tls_extant(name))
		return LWS_TLS_EXTANT_NO;
#else
	nvs_handle nvh;
	size_t s = 8192;

	if (nvs_open("lws-station", NVS_READWRITE, &nvh)) {
		lwsl_notice("%s: can't open nvs\n", __func__);
		return LWS_TLS_EXTANT_NO;
	}

	n = nvs_get_blob(nvh, name, NULL, &s);
	nvs_close(nvh);

	if (n)
		return LWS_TLS_EXTANT_NO;
#endif
#endif
	return LWS_TLS_EXTANT_YES;
}